

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O0

bool __thiscall pbrt::syntactic::ParamSet::hasParamString(ParamSet *this,string *name)

{
  bool bVar1;
  string *unaff_retaddr;
  ParamSet *in_stack_00000008;
  __shared_ptr local_20 [32];
  
  findParam<std::__cxx11::string>(in_stack_00000008,unaff_retaddr);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_20);
  std::
  shared_ptr<pbrt::syntactic::ParamArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~shared_ptr((shared_ptr<pbrt::syntactic::ParamArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)0x1a36da);
  return bVar1;
}

Assistant:

bool hasParamString(const std::string &name) const {
        return (bool)findParam<std::string>(name);
      }